

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniq_vector.h
# Opt level: O3

size_t __thiscall
re2c::uniq_vector_t<const_re2c::State_*>::find_or_add
          (uniq_vector_t<const_re2c::State_*> *this,State **v)

{
  pointer *pppSVar1;
  State **ppSVar2;
  iterator __position;
  size_t sVar3;
  size_t sVar4;
  
  ppSVar2 = (this->elems).
            super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->elems).super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  sVar3 = (long)__position._M_current - (long)ppSVar2 >> 3;
  if (__position._M_current != ppSVar2) {
    sVar4 = 0;
    do {
      if (ppSVar2[sVar4] == *v) {
        return sVar4;
      }
      sVar4 = sVar4 + 1;
    } while (sVar3 + (sVar3 == 0) != sVar4);
  }
  if (__position._M_current ==
      (this->elems).super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<re2c::State_const*,std::allocator<re2c::State_const*>>::
    _M_realloc_insert<re2c::State_const*const&>
              ((vector<re2c::State_const*,std::allocator<re2c::State_const*>> *)this,__position,v);
  }
  else {
    *__position._M_current = *v;
    pppSVar1 = &(this->elems).
                super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return sVar3;
}

Assistant:

size_t find_or_add (const value_t & v)
	{
		const size_t size = elems.size ();
		for (size_t i = 0; i < size; ++i)
		{
			if (elems[i] == v)
			{
				return i;
			}
		}
		elems.push_back (v);
		return size;
	}